

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void testing::internal::FailFromInternalError(int fd)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  ostream *poVar4;
  bool bVar5;
  int last_error;
  int num_read;
  char buffer [256];
  Message error;
  char (*in_stack_fffffffffffffe58) [256];
  Message *in_stack_fffffffffffffe60;
  Message *in_stack_fffffffffffffe68;
  string local_178 [8];
  Message *in_stack_fffffffffffffe90;
  GTestLog local_158;
  int local_154;
  string local_150 [28];
  int in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffed0;
  GTestLogSeverity in_stack_fffffffffffffedc;
  uint in_stack_fffffffffffffee0;
  undefined1 local_118 [280];
  
  Message::Message(in_stack_fffffffffffffe90);
  do {
    while (iVar1 = posix::Read((int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                               in_stack_fffffffffffffe58,0), 0 < iVar1) {
      local_118[iVar1] = 0;
      Message::operator<<(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    }
    bVar5 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar5 = *piVar2 == 4;
    }
  } while (bVar5);
  if (iVar1 == 0) {
    GTestLog::GTestLog((GTestLog *)(ulong)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                       in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    poVar3 = GTestLog::GetStream((GTestLog *)&stack0xfffffffffffffed0);
    Message::GetString_abi_cxx11_(in_stack_fffffffffffffe68);
    std::operator<<(poVar3,local_150);
    std::__cxx11::string::~string(local_150);
    GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffe60);
  }
  else {
    piVar2 = __errno_location();
    local_154 = *piVar2;
    GTestLog::GTestLog((GTestLog *)CONCAT44(iVar1,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc
                      );
    poVar3 = GTestLog::GetStream(&local_158);
    poVar3 = std::operator<<(poVar3,"Error while reading death test internal: ");
    GetLastErrnoDescription_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_178);
    poVar3 = std::operator<<(poVar3," [");
    poVar4 = (ostream *)std::ostream::operator<<(poVar3,local_154);
    std::operator<<(poVar4,"]");
    std::__cxx11::string::~string(local_178);
    GTestLog::~GTestLog((GTestLog *)poVar3);
  }
  Message::~Message((Message *)0x18b532);
  return;
}

Assistant:

static void FailFromInternalError(int fd) {
  Message error;
  char buffer[256];
  int num_read;

  do {
    while ((num_read = posix::Read(fd, buffer, 255)) > 0) {
      buffer[num_read] = '\0';
      error << buffer;
    }
  } while (num_read == -1 && errno == EINTR);

  if (num_read == 0) {
    GTEST_LOG_(FATAL) << error.GetString();
  } else {
    const int last_error = errno;
    GTEST_LOG_(FATAL) << "Error while reading death test internal: "
                      << GetLastErrnoDescription() << " [" << last_error << "]";
  }
}